

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sql.cpp
# Opt level: O2

void generate_tree_rules(vector<IsoTree,_std::allocator<IsoTree>_> *trees,
                        vector<IsoHPlane,_std::allocator<IsoHPlane>_> *hplanes,bool output_score,
                        size_t curr_ix,bool index1,string *prev_cond,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *node_rules,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *conditions_left,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *conditions_right,IsoForest *model_outputs,ExtIsoForest *model_outputs_ext)

{
  size_t *psVar1;
  char *__rhs;
  string *this;
  double dVar2;
  string cond_right;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  string cond_left;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (((trees == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) ||
      ((trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
       super__Vector_impl_data._M_start[curr_ix].tree_left != 0)) &&
     ((hplanes == (vector<IsoHPlane,_std::allocator<IsoHPlane>_> *)0x0 ||
      ((hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
       super__Vector_impl_data._M_start[curr_ix].hplane_left != 0)))) {
    __rhs = "\t\tAND (";
    if (curr_ix == 0) {
      __rhs = "\t\t    (";
    }
    std::operator+(&local_100,prev_cond,__rhs);
    std::operator+(&cond_right,&local_100,
                   (conditions_left->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + curr_ix);
    std::operator+(&cond_left,&cond_right,")\n");
    std::__cxx11::string::~string((string *)&cond_right);
    std::__cxx11::string::~string((string *)&local_100);
    if (trees == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) {
      psVar1 = &(hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                super__Vector_impl_data._M_start[curr_ix].hplane_left;
    }
    else {
      psVar1 = &(trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                super__Vector_impl_data._M_start[curr_ix].tree_left;
    }
    generate_tree_rules(trees,hplanes,output_score,*psVar1,index1,&cond_left,node_rules,
                        conditions_left,conditions_right,model_outputs,model_outputs_ext);
    cond_left._M_string_length = 0;
    *cond_left._M_dataplus._M_p = '\0';
    std::operator+(&local_b0,prev_cond,__rhs);
    std::operator+(&local_100,&local_b0,
                   (conditions_right->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + curr_ix);
    std::operator+(&cond_right,&local_100,")\n");
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_b0);
    if (trees == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) {
      psVar1 = &(hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                super__Vector_impl_data._M_start[curr_ix].hplane_right;
    }
    else {
      psVar1 = &(trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
                super__Vector_impl_data._M_start[curr_ix].tree_right;
    }
    generate_tree_rules(trees,hplanes,output_score,*psVar1,index1,&cond_right,node_rules,
                        conditions_left,conditions_right,model_outputs,model_outputs_ext);
    std::__cxx11::string::~string((string *)&cond_right);
    this = &cond_left;
    goto LAB_00313952;
  }
  std::operator+(&local_50,prev_cond,"\tTHEN ");
  if (output_score) {
    if (trees == (vector<IsoTree,_std::allocator<IsoTree>_> *)0x0) {
      if ((model_outputs_ext->scoring_metric == Density) ||
         (model_outputs_ext->scoring_metric == BoxedRatio)) {
        dVar2 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                super__Vector_impl_data._M_start[curr_ix].score;
        goto LAB_0031383d;
      }
      dVar2 = (hplanes->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
              super__Vector_impl_data._M_start[curr_ix].score;
    }
    else if ((model_outputs->scoring_metric == Density) ||
            (model_outputs->scoring_metric == BoxedRatio)) {
      dVar2 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
              super__Vector_impl_data._M_start[curr_ix].score;
LAB_0031383d:
      dVar2 = -dVar2;
    }
    else {
      dVar2 = (trees->super__Vector_base<IsoTree,_std::allocator<IsoTree>_>)._M_impl.
              super__Vector_impl_data._M_start[curr_ix].score;
    }
    std::__cxx11::to_string(&local_90,dVar2);
  }
  else {
    std::__cxx11::to_string
              (&local_90,
               (ulong)index1 +
               ((long)(node_rules->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
                (long)(node_rules->
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  std::operator+(&local_b0,&local_50,&local_90);
  std::operator+(&local_100,&local_b0,"\n---end of terminal node ");
  std::__cxx11::to_string
            (&local_70,
             (ulong)index1 +
             ((long)(node_rules->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_finish -
              (long)(node_rules->
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    )._M_impl.super__Vector_impl_data._M_start >> 5));
  std::operator+(&cond_right,&local_100,&local_70);
  std::operator+(&cond_left,&cond_right,"---\n");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<std::__cxx11::string>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)node_rules,
             &cond_left);
  std::__cxx11::string::~string((string *)&cond_left);
  std::__cxx11::string::~string((string *)&cond_right);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_100);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_90);
  this = &local_50;
LAB_00313952:
  std::__cxx11::string::~string((string *)this);
  return;
}

Assistant:

void generate_tree_rules(const std::vector<IsoTree> *trees, const std::vector<IsoHPlane> *hplanes, const bool output_score,
                         const size_t curr_ix, const bool index1, const std::string &prev_cond,
                         std::vector<std::string> &node_rules,
                         std::vector<std::string> &conditions_left, std::vector<std::string> &conditions_right,
                         const IsoForest *model_outputs, const ExtIsoForest *model_outputs_ext)
{
    // if ((trees != NULL && (*trees)[curr_ix].score >= 0) ||
    //     (hplanes != NULL && (*hplanes)[curr_ix].score >= 0))
    if ((trees != NULL && (*trees)[curr_ix].tree_left == 0) ||
        (hplanes != NULL && (*hplanes)[curr_ix].hplane_left == 0))
    {
        node_rules.push_back(prev_cond
                                + "\tTHEN "
                                + (output_score?
                                    (std::to_string((trees != NULL)?
                                        ((model_outputs->scoring_metric != Density && model_outputs->scoring_metric != BoxedRatio)?
                                            (*trees)[curr_ix].score : (-(*trees)[curr_ix].score))
                                            :
                                        ((model_outputs_ext->scoring_metric != Density && model_outputs_ext->scoring_metric != BoxedRatio)?
                                            (*hplanes)[curr_ix].score : (-(*hplanes)[curr_ix].score))))
                                        :
                                    (std::to_string(node_rules.size() + (size_t)index1)))
                                + "\n---end of terminal node "
                                + std::to_string(node_rules.size() + (size_t)index1)
                                + "---\n");
        return;
    }

    
    std::string cond_left = prev_cond
                                + ((curr_ix > 0)? "\t\tAND (" : "\t\t    (")
                                + conditions_left[curr_ix]
                                + ")\n";
    generate_tree_rules(trees, hplanes, output_score,
                        (trees != NULL)?
                            ((*trees)[curr_ix].tree_left) : ((*hplanes)[curr_ix].hplane_left),
                        index1, cond_left, node_rules,
                        conditions_left, conditions_right, model_outputs, model_outputs_ext);
    cond_left.clear();
    std::string cond_right = prev_cond
                                + ((curr_ix > 0)? "\t\tAND (" : "\t\t    (")
                                + conditions_right[curr_ix]
                                + ")\n";
    generate_tree_rules(trees, hplanes, output_score,
                        (trees != NULL)?
                            ((*trees)[curr_ix].tree_right) : ((*hplanes)[curr_ix].hplane_right),
                        index1, cond_right, node_rules,
                        conditions_left, conditions_right, model_outputs, model_outputs_ext);
}